

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O1

YV12_BUFFER_CONFIG *
av1_tf_info_get_filtered_buf(TEMPORAL_FILTER_INFO *tf_info,int gf_index,FRAME_DIFF *frame_diff)

{
  int64_t *piVar1;
  int64_t iVar2;
  YV12_BUFFER_CONFIG *pYVar3;
  YV12_BUFFER_CONFIG *pYVar4;
  long lVar5;
  
  if (tf_info->is_temporal_filter_on != 0) {
    pYVar4 = tf_info->tf_buf;
    lVar5 = 0;
    pYVar3 = (YV12_BUFFER_CONFIG *)0x0;
    do {
      if ((*(int *)((long)tf_info->tf_buf_valid + lVar5) != 0) &&
         (*(int *)((long)tf_info->tf_buf_gf_index + lVar5) == gf_index)) {
        piVar1 = (int64_t *)((long)&tf_info->frame_diff[0].sum + lVar5 * 4);
        iVar2 = piVar1[1];
        frame_diff->sum = *piVar1;
        frame_diff->sse = iVar2;
        pYVar3 = pYVar4;
      }
      lVar5 = lVar5 + 4;
      pYVar4 = pYVar4 + 1;
    } while (lVar5 == 4);
    return pYVar3;
  }
  return (YV12_BUFFER_CONFIG *)0x0;
}

Assistant:

YV12_BUFFER_CONFIG *av1_tf_info_get_filtered_buf(TEMPORAL_FILTER_INFO *tf_info,
                                                 int gf_index,
                                                 FRAME_DIFF *frame_diff) {
  if (tf_info->is_temporal_filter_on == 0) return NULL;
  YV12_BUFFER_CONFIG *out_buf = NULL;
  for (int i = 0; i < TF_INFO_BUF_COUNT; ++i) {
    if (tf_info->tf_buf_valid[i] && tf_info->tf_buf_gf_index[i] == gf_index) {
      out_buf = &tf_info->tf_buf[i];
      *frame_diff = tf_info->frame_diff[i];
    }
  }
  return out_buf;
}